

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboRenderTest.cpp
# Opt level: O1

void deqp::gles3::Functional::checkColorFormatSupport(Context *context,deUint32 sizedFormat)

{
  uint uVar1;
  pointer pcVar2;
  int iVar3;
  undefined4 extraout_var;
  istream *piVar4;
  NotSupportedError *this;
  string *sep;
  long lVar5;
  pointer pbVar6;
  bool bVar7;
  size_type __dnew;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  requiredExts;
  istringstream extensions;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_218;
  Context *local_1f8;
  undefined1 local_1f0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0 [3];
  ios_base local_138 [264];
  
  local_218.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_218.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_218.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f8 = context;
  if ((int)sizedFormat < 0x8814) {
    switch(sizedFormat) {
    case 0x822d:
    case 0x822f:
switchD_012c3086_caseD_822d:
      local_238._M_dataplus._M_p = (pointer)0x1e;
      local_1b0[0]._M_dataplus._M_p = (pointer)&local_1b0[0].field_2;
      local_1b0[0]._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)local_1b0,(ulong)&local_238);
      local_1b0[0].field_2._M_allocated_capacity = local_238._M_dataplus._M_p;
      builtin_strncpy(local_1b0[0]._M_dataplus._M_p,"GL_EXT_color_buffer_half_float",0x1e);
      local_1b0[0]._M_string_length = (size_type)local_238._M_dataplus._M_p;
      local_1b0[0]._M_dataplus._M_p[(long)local_238._M_dataplus._M_p] = '\0';
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_218,
                 local_1b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0[0]._M_dataplus._M_p != &local_1b0[0].field_2) {
        operator_delete(local_1b0[0]._M_dataplus._M_p,
                        (ulong)(local_1b0[0].field_2._M_allocated_capacity + 1));
      }
      break;
    case 0x822e:
    case 0x8230:
      break;
    default:
      goto switchD_012c3086_default;
    }
switchD_012c3086_caseD_822e:
    local_1b0[0]._M_dataplus._M_p = (pointer)&local_1b0[0].field_2;
    local_238._M_dataplus._M_p = (pointer)0x19;
    local_1b0[0]._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)local_1b0,(ulong)&local_238);
    local_1b0[0].field_2._M_allocated_capacity = local_238._M_dataplus._M_p;
    builtin_strncpy(local_1b0[0]._M_dataplus._M_p,"GL_EXT_color_buffer_float",0x19);
    local_1b0[0]._M_string_length = (size_type)local_238._M_dataplus._M_p;
    local_1b0[0]._M_dataplus._M_p[(long)local_238._M_dataplus._M_p] = '\0';
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_218,
               local_1b0);
  }
  else {
    if ((int)sizedFormat < 0x881b) {
      if (1 < sizedFormat - 0x8814) {
        if (sizedFormat != 0x881a) goto switchD_012c3086_default;
        goto switchD_012c3086_caseD_822d;
      }
      goto switchD_012c3086_caseD_822e;
    }
    if (sizedFormat == 0x8c3a) goto switchD_012c3086_caseD_822e;
    if (sizedFormat != 0x881b) goto switchD_012c3086_default;
    local_1b0[0]._M_dataplus._M_p = (pointer)&local_1b0[0].field_2;
    local_238._M_dataplus._M_p = (pointer)0x1e;
    local_1b0[0]._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)local_1b0,(ulong)&local_238);
    local_1b0[0].field_2._M_allocated_capacity = local_238._M_dataplus._M_p;
    builtin_strncpy(local_1b0[0]._M_dataplus._M_p,"GL_EXT_color_buffer_half_float",0x1e);
    local_1b0[0]._M_string_length = (size_type)local_238._M_dataplus._M_p;
    local_1b0[0]._M_dataplus._M_p[(long)local_238._M_dataplus._M_p] = '\0';
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_218,
               local_1b0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0[0]._M_dataplus._M_p != &local_1b0[0].field_2) {
    operator_delete(local_1b0[0]._M_dataplus._M_p,
                    (ulong)(local_1b0[0].field_2._M_allocated_capacity + 1));
  }
switchD_012c3086_default:
  if (local_218.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_218.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar7 = true;
    pbVar6 = local_218.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      iVar3 = (*local_1f8->_vptr_Context[0x7c])(local_1f8,0x1f03);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_238,(char *)CONCAT44(extraout_var,iVar3),
                 (allocator<char> *)local_1d0._M_local_buf);
      std::__cxx11::istringstream::istringstream
                ((istringstream *)local_1b0,(string *)&local_238,_S_in);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,
                        CONCAT71(local_238.field_2._M_allocated_capacity._1_7_,
                                 local_238.field_2._M_local_buf[0]) + 1);
      }
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      local_238._M_string_length = 0;
      local_238.field_2._M_local_buf[0] = '\0';
      do {
        piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)local_1b0,(string *)&local_238,' ');
        sep = *(string **)(*(long *)piVar4 + -0x18);
        uVar1 = *(uint *)(piVar4 + 0x20 + (long)sep);
        if ((uVar1 & 5) != 0) break;
        iVar3 = std::__cxx11::string::compare((char *)&local_238);
      } while (iVar3 != 0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,
                        CONCAT71(local_238.field_2._M_allocated_capacity._1_7_,
                                 local_238.field_2._M_local_buf[0]) + 1);
      }
      std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
      std::ios_base::~ios_base(local_138);
      if ((uVar1 & 5) == 0) break;
      pbVar6 = pbVar6 + 1;
      bVar7 = pbVar6 != local_218.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
    } while (bVar7);
    if (!bVar7) {
      lVar5 = (long)local_218.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_218.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      if (lVar5 == 0x20) {
        local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
        pcVar2 = ((local_218.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_238,pcVar2,
                   pcVar2 + (local_218.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
      }
      else {
        local_1f0._0_8_ = local_1f0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,", ","");
        join<std::__cxx11::string>
                  ((string *)&local_1d0,(Functional *)&local_218,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_1f0,sep);
        std::operator+(&local_238," one of the following: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1d0);
      }
      std::operator+(local_1b0,"Format not supported, requires ",&local_238);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,
                        CONCAT71(local_238.field_2._M_allocated_capacity._1_7_,
                                 local_238.field_2._M_local_buf[0]) + 1);
      }
      if (lVar5 != 0x20) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_allocated_capacity != &local_1c0) {
          operator_delete((void *)local_1d0._M_allocated_capacity,
                          local_1c0._M_allocated_capacity + 1);
        }
        if ((pointer)local_1f0._0_8_ != (pointer)(local_1f0 + 0x10)) {
          operator_delete((void *)local_1f0._0_8_,
                          (ulong)((long)&((_Alloc_hider *)local_1f0._16_8_)->_M_p + 1));
        }
      }
      this = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError(this,local_1b0);
      __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_218);
  return;
}

Assistant:

static void checkColorFormatSupport (sglr::Context& context, deUint32 sizedFormat)
{
	const std::vector<std::string> requiredExts = getEnablingExtensions(sizedFormat);

	if (!isAnyExtensionSupported(context, requiredExts))
	{
		std::string	errMsg	= "Format not supported, requires "
							+ ((requiredExts.size() == 1) ? requiredExts[0] : " one of the following: " + join(requiredExts, ", "));

		throw tcu::NotSupportedError(errMsg);
	}
}